

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

char * dmrC_show_pseudo(dmr_C *C,pseudo_t pseudo)

{
  byte bVar1;
  pseudo_type pVar2;
  linearizer_state_t *plVar3;
  symbol *psVar4;
  expression *peVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar8;
  char *pcVar9;
  char *__s;
  
  if (pseudo == (pseudo_t)0x0) {
    return "no pseudo";
  }
  plVar3 = C->L;
  if (&plVar3->void_pseudo == pseudo) {
    return "VOID";
  }
  uVar8 = plVar3->n + 1;
  plVar3->n = uVar8;
  __s = plVar3->pseudo_buffer[0] + ((uVar8 & 3) << 6);
  pVar2 = pseudo->type;
  switch(pVar2) {
  case PSEUDO_REG:
    uVar8 = pseudo->nr;
    pcVar9 = "%%r%d";
    break;
  case PSEUDO_SYM:
    psVar4 = (pseudo->field_5).sym;
    if ((psVar4->field_15).bb_target == (basic_block *)0x0) {
      if (psVar4->ident == (ident *)0x0) {
        peVar5 = (psVar4->field_14).field_2.initializer;
        iVar7 = snprintf(__s,0x40,"<anon symbol:%p>");
        pcVar9 = (char *)CONCAT44(extraout_var_01,iVar7);
        bVar6 = true;
        if (peVar5 != (expression *)0x0) {
          bVar1 = *(byte *)peVar5;
          pcVar9 = (char *)(ulong)bVar1;
          if (bVar1 == 2) {
            pcVar9 = dmrC_show_string(C,(peVar5->field_5).field_2.string);
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (bVar1 == 1) {
              iVar7 = snprintf(__s,0x40,"<symbol value: %lld>",(peVar5->field_5).field_0.value);
              pcVar9 = (char *)CONCAT44(extraout_var_02,iVar7);
            }
          }
        }
        goto LAB_0012e3ce;
      }
      pcVar9 = dmrC_show_ident(C,psVar4->ident);
      iVar7 = snprintf(__s,0x40,"%s",pcVar9);
      pcVar9 = (char *)CONCAT44(extraout_var_00,iVar7);
    }
    else {
      iVar7 = snprintf(__s,0x40,".L%u",(ulong)((psVar4->field_15).bb_target)->nr);
      pcVar9 = (char *)CONCAT44(extraout_var,iVar7);
    }
    bVar6 = true;
LAB_0012e3ce:
    if (bVar6) {
      return __s;
    }
    return pcVar9;
  case PSEUDO_VAL:
    if ((pseudo->field_5).value - 0x3e9U < 0xfffffffffffff82f) {
      pcVar9 = "$%#llx";
    }
    else {
      pcVar9 = "$%lld";
    }
    snprintf(__s,0x40,pcVar9);
    return __s;
  case PSEUDO_ARG:
    pVar2 = pseudo->nr;
    pcVar9 = "%%arg%d";
    goto LAB_0012e380;
  case PSEUDO_PHI:
    uVar8 = pseudo->nr;
    pcVar9 = "%%phi%d";
    break;
  default:
    pcVar9 = "<bad pseudo type %d>";
LAB_0012e380:
    snprintf(__s,0x40,pcVar9,(ulong)pVar2);
    return __s;
  }
  iVar7 = snprintf(__s,0x40,pcVar9,(ulong)uVar8);
  if (pseudo->ident != (ident *)0x0) {
    pcVar9 = dmrC_show_ident(C,pseudo->ident);
    sprintf(__s + iVar7,"(%s)",pcVar9);
  }
  return __s;
}

Assistant:

const char *dmrC_show_pseudo(struct dmr_C *C, pseudo_t pseudo)
{
	char *buf;
	int i;

	if (!pseudo)
		return "no pseudo";
	if (pseudo == VOID_PSEUDO(C))
		return "VOID";
	buf = C->L->pseudo_buffer[3 & ++C->L->n];
	switch(pseudo->type) {
	case PSEUDO_SYM: {
		struct symbol *sym = pseudo->sym;
		struct expression *expr;

		if (sym->bb_target) {
			snprintf(buf, 64, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			snprintf(buf, 64, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		expr = sym->initializer;
		snprintf(buf, 64, "<anon symbol:%p>", sym);
		if (expr) {
			switch (expr->type) {
			case EXPR_VALUE:
				snprintf(buf, 64, "<symbol value: %lld>", expr->value);
				break;
			case EXPR_STRING:
				return dmrC_show_string(C, expr->string);
			default:
				break;
			}
		}
		break;
	}
	case PSEUDO_REG:
		i = snprintf(buf, 64, "%%r%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	case PSEUDO_VAL: {
		long long value = pseudo->value;
		if (value > 1000 || value < -1000)
			snprintf(buf, 64, "$%#llx", value);
		else
			snprintf(buf, 64, "$%lld", value);
		break;
	}
	case PSEUDO_ARG:
		snprintf(buf, 64, "%%arg%d", pseudo->nr);
		break;
	case PSEUDO_PHI:
		i = snprintf(buf, 64, "%%phi%d", pseudo->nr);
		if (pseudo->ident)
			sprintf(buf+i, "(%s)", dmrC_show_ident(C, pseudo->ident));
		break;
	default:
		snprintf(buf, 64, "<bad pseudo type %d>", pseudo->type);
	}
	return buf;
}